

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::SourceLineInfo::SourceLineInfo(SourceLineInfo *this,SourceLineInfo *other)

{
  SourceLineInfo *other_local;
  SourceLineInfo *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)other);
  this->line = other->line;
  return;
}

Assistant:

SourceLineInfo::SourceLineInfo( SourceLineInfo const& other )
    :   file( other.file ),
        line( other.line )
    {}